

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

JsonNode * jsonLookupStep(JsonParse *pParse,u32 iRoot,char *zPath,int *pApnd,char **pzErr)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  JsonNode *pJVar6;
  uint uVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  JsonNode *pJVar11;
  u8 *puVar12;
  int iVar13;
  char *__s2;
  uint uVar14;
  JsonNode *pJVar15;
  bool bVar16;
  ulong local_58;
  
  local_58 = (ulong)iRoot;
LAB_001beaaf:
  pJVar6 = pParse->aNode;
  pJVar15 = pJVar6 + local_58;
  cVar2 = *zPath;
  if (cVar2 != '\0') {
    if ((pJVar15->jnFlags & 8) == 0) {
      if (cVar2 == '.') {
        if (pJVar15->eType == '\a') {
          pcVar1 = zPath + 1;
          if (zPath[1] == '\"') {
            uVar8 = 0;
            do {
              uVar14 = uVar8;
              if (pcVar1[uVar14 + 1] == '\0') goto LAB_001bee1f;
              uVar8 = uVar14 + 1;
            } while (pcVar1[uVar14 + 1] != '\"');
            __s2 = zPath + 2;
            uVar8 = uVar14 + 2;
LAB_001bec15:
            do {
              uVar7 = pJVar15->n;
              iVar13 = (int)local_58;
              if (uVar7 != 0) {
                uVar5 = 1;
                do {
                  if ((pJVar15[uVar5].jnFlags & 1) == 0) {
                    if (pJVar15[uVar5].n == uVar14 + 2) {
                      puVar12 = &(pJVar15[uVar5].u.pPatch)->jnFlags;
LAB_001bec6e:
                      iVar3 = strncmp((char *)puVar12,__s2,(ulong)uVar14);
                      if (iVar3 == 0) {
                        local_58 = (ulong)(iVar13 + (int)uVar5 + 1);
                        zPath = pcVar1 + uVar8;
                        goto LAB_001beaaf;
                      }
                    }
                  }
                  else if (pJVar15[uVar5].n == uVar14) {
                    puVar12 = (u8 *)pJVar15[uVar5].u.zJContent;
                    goto LAB_001bec6e;
                  }
                  uVar10 = (int)uVar5 + 1;
                  iVar3 = 1;
                  if (5 < pJVar15[uVar10].eType) {
                    iVar3 = pJVar15[uVar10].n + 1;
                  }
                  uVar5 = (ulong)(iVar3 + uVar10);
                } while (iVar3 + uVar10 <= uVar7);
              }
              if ((pJVar15->jnFlags & 0x20) == 0) {
                if (pApnd != (int *)0x0) {
                  iVar3 = jsonParseAddNode(pParse,7,2,(char *)0x0);
                  uVar14 = jsonParseAddNode(pParse,5,uVar14,__s2);
                  pJVar6 = jsonLookupAppend(pParse,pcVar1 + uVar8,pApnd,pzErr);
                  if (pParse->oom != '\0') {
                    return (JsonNode *)0x0;
                  }
                  if (pJVar6 == (JsonNode *)0x0) {
                    return (JsonNode *)0x0;
                  }
                  pJVar15 = pParse->aNode;
                  pJVar15[local_58].u.iAppend = iVar3 - iVar13;
                  puVar12 = &pJVar15[local_58].jnFlags;
                  *puVar12 = *puVar12 | 0x20;
                  puVar12 = &pParse->aNode[uVar14].jnFlags;
                  *puVar12 = *puVar12 | 1;
                  return pJVar6;
                }
                goto LAB_001bee26;
              }
              local_58 = (ulong)(iVar13 + (pJVar15->u).iAppend);
              pJVar15 = pJVar6 + local_58;
            } while( true );
          }
          for (uVar14 = 0;
              ((cVar2 = pcVar1[uVar14], cVar2 != '\0' && (cVar2 != '.')) && (cVar2 != '['));
              uVar14 = uVar14 + 1) {
          }
          __s2 = pcVar1;
          uVar8 = uVar14;
          if (uVar14 != 0) goto LAB_001bec15;
LAB_001bee1f:
          *pzErr = pcVar1;
        }
      }
      else if (cVar2 == '[') {
        bVar9 = zPath[1];
        uVar5 = (ulong)bVar9;
        if (uVar5 - 0x3a < 0xfffffffffffffff6) {
          uVar8 = 0;
          uVar4 = 1;
        }
        else {
          uVar4 = 1;
          uVar8 = 0;
          do {
            uVar8 = ((int)(char)uVar5 + uVar8 * 10) - 0x30;
            uVar4 = (ulong)((int)uVar4 + 1);
            bVar9 = zPath[uVar4];
            uVar5 = (ulong)bVar9;
          } while (0xfffffffffffffff5 < uVar5 - 0x3a);
        }
        uVar14 = (uint)uVar4;
        if ((uVar14 < 2) || (bVar9 != 0x5d)) {
          if (zPath[1] != '#') goto LAB_001beed1;
          pJVar11 = pJVar15;
          uVar5 = local_58;
          if (pJVar15->eType == '\x06') {
            while( true ) {
              uVar7 = uVar8;
              for (; (uint)uVar4 <= pJVar11->n; uVar4 = (ulong)((uint)uVar4 + iVar13)) {
                uVar7 = uVar7 + ((pJVar11[uVar4].jnFlags & 4) == 0);
                iVar13 = 1;
                if (5 < pJVar11[uVar4].eType) {
                  iVar13 = pJVar11[uVar4].n + 1;
                }
              }
              uVar8 = uVar7;
              if ((pJVar11->jnFlags & 0x20) == 0) break;
              uVar14 = (int)uVar5 + (pJVar11->u).iAppend;
              uVar4 = 1;
              pJVar11 = pJVar6 + (int)uVar14;
              uVar5 = (ulong)uVar14;
            }
            uVar5 = 2;
            if ((zPath[2] == '-') && (0xfffffffffffffff5 < (ulong)(byte)zPath[3] - 0x3a)) {
              uVar10 = 0;
              uVar5 = 3;
              do {
                uVar10 = ((int)zPath[uVar5] + uVar10 * 10) - 0x30;
                uVar14 = (int)uVar5 + 1;
                uVar5 = (ulong)uVar14;
              } while (0xfffffffffffffff5 < (ulong)(byte)zPath[uVar5] - 0x3a);
              bVar16 = false;
              uVar8 = uVar10;
              if (uVar7 < uVar10) {
                uVar8 = 0;
              }
              uVar8 = uVar7 - uVar8;
              if (uVar7 < uVar10) goto LAB_001bed2c;
            }
            uVar14 = (uint)uVar5;
            bVar16 = zPath[uVar5] == ']';
            if (!bVar16) {
              *pzErr = zPath;
            }
          }
          else {
            bVar16 = false;
          }
LAB_001bed2c:
          if (!bVar16) goto LAB_001bee26;
        }
        if (pJVar15->eType == '\x06') {
          do {
            uVar7 = pJVar15->n;
            bVar16 = uVar7 == 0;
            uVar10 = 1;
            if (!bVar16) {
              do {
                if ((uVar8 == 0) && ((pJVar15[uVar10].jnFlags & 4) == 0)) break;
                iVar13 = 1;
                if (5 < pJVar15[uVar10].eType) {
                  iVar13 = pJVar15[uVar10].n + 1;
                }
                uVar8 = uVar8 + (int)(char)(((pJVar15[uVar10].jnFlags >> 2 & 1) != 0) + -1);
                uVar10 = uVar10 + iVar13;
                bVar16 = uVar7 < uVar10;
              } while (uVar10 <= uVar7);
            }
            iVar13 = (int)local_58;
            if ((pJVar15->jnFlags & 0x20) == 0) goto LAB_001bedc0;
            local_58 = (ulong)(iVar13 + (pJVar15->u).iAppend);
            pJVar15 = pParse->aNode + local_58;
          } while( true );
        }
      }
      else {
LAB_001beed1:
        *pzErr = zPath;
      }
    }
LAB_001bee26:
    pJVar15 = (JsonNode *)0x0;
  }
  return pJVar15;
LAB_001bedc0:
  zPath = zPath + (uVar14 + 1);
  if (bVar16) {
    if (pApnd == (int *)0x0) {
      return (JsonNode *)0x0;
    }
    if (uVar8 != 0) {
      return (JsonNode *)0x0;
    }
    iVar3 = jsonParseAddNode(pParse,6,1,(char *)0x0);
    pJVar6 = jsonLookupAppend(pParse,zPath,pApnd,pzErr);
    if (pParse->oom != '\0') {
      return (JsonNode *)0x0;
    }
    if (pJVar6 == (JsonNode *)0x0) {
      return (JsonNode *)0x0;
    }
    pJVar15 = pParse->aNode;
    pJVar15[local_58].u.iAppend = iVar3 - iVar13;
    puVar12 = &pJVar15[local_58].jnFlags;
    *puVar12 = *puVar12 | 0x20;
    return pJVar6;
  }
  local_58 = (ulong)(uVar10 + iVar13);
  goto LAB_001beaaf;
}

Assistant:

static JsonNode *jsonLookupStep(
  JsonParse *pParse,      /* The JSON to search */
  u32 iRoot,              /* Begin the search at this node */
  const char *zPath,      /* The path to search */
  int *pApnd,             /* Append nodes to complete path if not NULL */
  const char **pzErr      /* Make *pzErr point to any syntax error in zPath */
){
  u32 i, j, nKey;
  const char *zKey;
  JsonNode *pRoot = &pParse->aNode[iRoot];
  if( zPath[0]==0 ) return pRoot;
  if( pRoot->jnFlags & JNODE_REPLACE ) return 0;
  if( zPath[0]=='.' ){
    if( pRoot->eType!=JSON_OBJECT ) return 0;
    zPath++;
    if( zPath[0]=='"' ){
      zKey = zPath + 1;
      for(i=1; zPath[i] && zPath[i]!='"'; i++){}
      nKey = i-1;
      if( zPath[i] ){
        i++;
      }else{
        *pzErr = zPath;
        return 0;
      }
      testcase( nKey==0 );
    }else{
      zKey = zPath;
      for(i=0; zPath[i] && zPath[i]!='.' && zPath[i]!='['; i++){}
      nKey = i;
      if( nKey==0 ){
        *pzErr = zPath;
        return 0;
      }
    }
    j = 1;
    for(;;){
      while( j<=pRoot->n ){
        if( jsonLabelCompare(pRoot+j, zKey, nKey) ){
          return jsonLookupStep(pParse, iRoot+j+1, &zPath[i], pApnd, pzErr);
        }
        j++;
        j += jsonNodeSize(&pRoot[j]);
      }
      if( (pRoot->jnFlags & JNODE_APPEND)==0 ) break;
      assert( pRoot->eU==2 );
      iRoot += pRoot->u.iAppend;
      pRoot = &pParse->aNode[iRoot];
      j = 1;
    }
    if( pApnd ){
      u32 iStart, iLabel;
      JsonNode *pNode;
      iStart = jsonParseAddNode(pParse, JSON_OBJECT, 2, 0);
      iLabel = jsonParseAddNode(pParse, JSON_STRING, nKey, zKey);
      zPath += i;
      pNode = jsonLookupAppend(pParse, zPath, pApnd, pzErr);
      if( pParse->oom ) return 0;
      if( pNode ){
        pRoot = &pParse->aNode[iRoot];
        assert( pRoot->eU==0 );
        pRoot->u.iAppend = iStart - iRoot;
        pRoot->jnFlags |= JNODE_APPEND;
        VVA( pRoot->eU = 2 );
        pParse->aNode[iLabel].jnFlags |= JNODE_RAW;
      }
      return pNode;
    }
  }else if( zPath[0]=='[' ){
    i = 0;
    j = 1;
    while( sqlite3Isdigit(zPath[j]) ){
      i = i*10 + zPath[j] - '0';
      j++;
    }
    if( j<2 || zPath[j]!=']' ){
      if( zPath[1]=='#' ){
        JsonNode *pBase = pRoot;
        int iBase = iRoot;
        if( pRoot->eType!=JSON_ARRAY ) return 0;
        for(;;){
          while( j<=pBase->n ){
            if( (pBase[j].jnFlags & JNODE_REMOVE)==0 ) i++;
            j += jsonNodeSize(&pBase[j]);
          }
          if( (pBase->jnFlags & JNODE_APPEND)==0 ) break;
          assert( pBase->eU==2 );
          iBase += pBase->u.iAppend;
          pBase = &pParse->aNode[iBase];
          j = 1;
        }
        j = 2;
        if( zPath[2]=='-' && sqlite3Isdigit(zPath[3]) ){
          unsigned int x = 0;
          j = 3;
          do{
            x = x*10 + zPath[j] - '0';
            j++;
          }while( sqlite3Isdigit(zPath[j]) );
          if( x>i ) return 0;
          i -= x;
        }
        if( zPath[j]!=']' ){
          *pzErr = zPath;
          return 0;
        }
      }else{
        *pzErr = zPath;
        return 0;
      }
    }
    if( pRoot->eType!=JSON_ARRAY ) return 0;
    zPath += j + 1;
    j = 1;
    for(;;){
      while( j<=pRoot->n && (i>0 || (pRoot[j].jnFlags & JNODE_REMOVE)!=0) ){
        if( (pRoot[j].jnFlags & JNODE_REMOVE)==0 ) i--;
        j += jsonNodeSize(&pRoot[j]);
      }
      if( (pRoot->jnFlags & JNODE_APPEND)==0 ) break;
      assert( pRoot->eU==2 );
      iRoot += pRoot->u.iAppend;
      pRoot = &pParse->aNode[iRoot];
      j = 1;
    }
    if( j<=pRoot->n ){
      return jsonLookupStep(pParse, iRoot+j, zPath, pApnd, pzErr);
    }
    if( i==0 && pApnd ){
      u32 iStart;
      JsonNode *pNode;
      iStart = jsonParseAddNode(pParse, JSON_ARRAY, 1, 0);
      pNode = jsonLookupAppend(pParse, zPath, pApnd, pzErr);
      if( pParse->oom ) return 0;
      if( pNode ){
        pRoot = &pParse->aNode[iRoot];
        assert( pRoot->eU==0 );
        pRoot->u.iAppend = iStart - iRoot;
        pRoot->jnFlags |= JNODE_APPEND;
        VVA( pRoot->eU = 2 );
      }
      return pNode;
    }
  }else{
    *pzErr = zPath;
  }
  return 0;
}